

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

void __thiscall Rml::ElementHandle::ProcessDefaultAction(ElementHandle *this,Event *event)

{
  ElementAttributes *this_00;
  Vector2f *drag_delta_min;
  Vector2f *drag_delta_max;
  undefined1 auVar1 [16];
  Vector2f VVar2;
  Vector2f VVar3;
  Vector2<float> VVar4;
  Vector2<float> VVar5;
  undefined4 uVar6;
  bool bVar7;
  ElementHandle *pEVar8;
  ElementDocument *pEVar9;
  Element *pEVar10;
  Context *context;
  type pVVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  allocator<char> local_16a;
  allocator<char> local_169;
  undefined1 local_168 [16];
  HandleEdgeMarginParser parser;
  float local_d8;
  float fStack_d4;
  String local_c8;
  String edge_margin_str;
  String move_target_name;
  String size_target_name;
  float local_48;
  float fStack_44;
  
  Element::ProcessDefaultAction(&this->super_Element,event);
  pEVar8 = (ElementHandle *)Event::GetTargetElement(event);
  if (pEVar8 == this) {
    if (this->initialised == false) {
      pEVar9 = Element::GetOwnerDocument(&this->super_Element);
      if (pEVar9 != (ElementDocument *)0x0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parser,"move_target",(allocator<char> *)&edge_margin_str);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&size_target_name,"",(allocator<char> *)&local_c8);
        this_00 = &(this->super_Element).attributes;
        Get<std::__cxx11::string>
                  (&move_target_name,(Rml *)this_00,(Dictionary *)&parser,&size_target_name,in_R8);
        ::std::__cxx11::string::~string((string *)&size_target_name);
        ::std::__cxx11::string::~string((string *)&parser);
        if (move_target_name._M_string_length != 0) {
          pEVar10 = Element::GetElementById(&this->super_Element,&move_target_name);
          this->move_target = pEVar10;
        }
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parser,"size_target",(allocator<char> *)&local_c8);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&edge_margin_str,"",&local_16a);
        Get<std::__cxx11::string>
                  (&size_target_name,(Rml *)this_00,(Dictionary *)&parser,&edge_margin_str,in_R8);
        ::std::__cxx11::string::~string((string *)&edge_margin_str);
        ::std::__cxx11::string::~string((string *)&parser);
        if (size_target_name._M_string_length != 0) {
          pEVar10 = Element::GetElementById(&this->super_Element,&size_target_name);
          this->size_target = pEVar10;
        }
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parser,"edge_margin",&local_16a);
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"0px",&local_169);
        Get<std::__cxx11::string>
                  (&edge_margin_str,(Rml *)this_00,(Dictionary *)&parser,&local_c8,in_R8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::__cxx11::string::~string((string *)&parser);
        (this->edge_margin)._M_elems[2].number = 0.0;
        (this->edge_margin)._M_elems[2].unit = UNKNOWN;
        (this->edge_margin)._M_elems[3].number = 0.0;
        (this->edge_margin)._M_elems[3].unit = UNKNOWN;
        (this->edge_margin)._M_elems[0].number = 0.0;
        (this->edge_margin)._M_elems[0].unit = UNKNOWN;
        (this->edge_margin)._M_elems[1].number = 0.0;
        (this->edge_margin)._M_elems[1].unit = UNKNOWN;
        bVar7 = ::std::operator!=(&edge_margin_str,"none");
        if (bVar7) {
          HandleEdgeMarginParser::HandleEdgeMarginParser(&parser);
          bVar7 = HandleEdgeMarginParser::Parse(&parser,&edge_margin_str,&this->edge_margin);
          if (!bVar7) {
            Element::GetAddress_abi_cxx11_(&local_c8,&this->super_Element,false,true);
            Log::Message(LT_WARNING,"Failed to parse \'edge_margin\' attribute for element \'%s\'.",
                         local_c8._M_dataplus._M_p);
            ::std::__cxx11::string::~string((string *)&local_c8);
          }
          PropertySpecification::~PropertySpecification(&parser.specification);
        }
        this->initialised = true;
        ::std::__cxx11::string::~string((string *)&edge_margin_str);
        ::std::__cxx11::string::~string((string *)&size_target_name);
        ::std::__cxx11::string::~string((string *)&move_target_name);
      }
    }
    bVar7 = Event::operator==(event,Dragstart);
    if (bVar7) {
      context = Element::GetContext(&this->super_Element);
      VVar2 = Event::GetUnprojectedMouseScreenPos(event);
      this->drag_start = VVar2;
      drag_delta_min = &this->drag_delta_min;
      drag_delta_max = &this->drag_delta_max;
      (this->drag_delta_min).x = -3.4028235e+38;
      (this->drag_delta_min).y = -3.4028235e+38;
      (this->drag_delta_max).x = 3.4028235e+38;
      (this->drag_delta_max).y = 3.4028235e+38;
      if (context != (Context *)0x0 && this->move_target != (Element *)0x0) {
        ElementHandleTargetData::ElementHandleTargetData
                  ((ElementHandleTargetData *)&parser,this->move_target,context,&this->edge_margin);
        ElementHandleTargetData::GetMoveData
                  ((MoveData *)&move_target_name,(ElementHandleTargetData *)&parser,drag_delta_min,
                   drag_delta_max);
        uVar6 = move_target_name.field_2._M_allocated_capacity._0_4_;
        (this->move_data).top_left.x = (bool)move_target_name.field_2._M_allocated_capacity._0_1_;
        (this->move_data).top_left.y = (bool)move_target_name.field_2._1_1_;
        (this->move_data).bottom_right.x = (bool)move_target_name.field_2._2_1_;
        (this->move_data).bottom_right.y = (bool)move_target_name.field_2._3_1_;
        (this->move_data).original_position_top_left = (Vector2f)move_target_name._M_dataplus._M_p;
        (this->move_data).original_position_bottom_right.x =
             (float)(undefined4)move_target_name._M_string_length;
        (this->move_data).original_position_bottom_right.y =
             (float)move_target_name._M_string_length._4_4_;
        move_target_name.field_2._M_allocated_capacity._0_4_ = uVar6;
      }
      if (this->size_target != (Element *)0x0 && context != (Context *)0x0) {
        ElementHandleTargetData::ElementHandleTargetData
                  ((ElementHandleTargetData *)&parser,this->size_target,context,&this->edge_margin);
        ElementHandleTargetData::GetSizeData
                  ((SizeData *)&move_target_name,(ElementHandleTargetData *)&parser,drag_delta_min,
                   drag_delta_max);
        (this->size_data).width_height.x =
             (bool)move_target_name.field_2._M_allocated_capacity._0_1_;
        (this->size_data).width_height.y = (bool)move_target_name.field_2._1_1_;
        (this->size_data).bottom_right.x = (bool)move_target_name.field_2._2_1_;
        (this->size_data).bottom_right.y = (bool)move_target_name.field_2._3_1_;
        (this->size_data).original_size = (Vector2f)move_target_name._M_dataplus._M_p;
        (this->size_data).original_position_bottom_right.x =
             (float)(undefined4)move_target_name._M_string_length;
        (this->size_data).original_position_bottom_right.y =
             (float)move_target_name._M_string_length._4_4_;
      }
      VVar2 = Math::Min<Rml::Vector2<float>>(*drag_delta_min,(Vector2f)0x0);
      *drag_delta_min = VVar2;
      VVar2 = Math::Max<Rml::Vector2<float>>(*drag_delta_max,(Vector2f)0x0);
      *drag_delta_max = VVar2;
    }
    else {
      bVar7 = Event::operator==(event,Drag);
      if (bVar7) {
        VVar3 = Event::GetUnprojectedMouseScreenPos(event);
        VVar2.y = VVar3.y - (this->drag_start).y;
        VVar2.x = VVar3.x - (this->drag_start).x;
        move_target_name._M_dataplus._M_p =
             (pointer)Math::Clamp<Rml::Vector2<float>>
                                (VVar2,this->drag_delta_min,this->drag_delta_max);
        auVar1._8_4_ = extraout_XMM0_Dc;
        auVar1._0_4_ = SUB84(move_target_name._M_dataplus._M_p,0);
        auVar1._4_4_ = SUB84(move_target_name._M_dataplus._M_p,4);
        auVar1._12_4_ = extraout_XMM0_Dd;
        local_168 = auVar1;
        if (this->move_target != (Element *)0x0) {
          VVar2 = (this->move_data).original_position_top_left;
          local_168._0_4_ = SUB84(move_target_name._M_dataplus._M_p,0);
          local_168._4_4_ = SUB84(move_target_name._M_dataplus._M_p,4);
          parser.specification.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(VVar2.y + (float)local_168._4_4_,VVar2.x + (float)local_168._0_4_);
          VVar4 = Vector2<float>::Round((Vector2<float> *)&parser);
          VVar2 = (this->move_data).original_position_bottom_right;
          parser.specification.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(VVar2.y - (float)local_168._4_4_,VVar2.x - (float)local_168._0_4_);
          VVar5 = Vector2<float>::Round((Vector2<float> *)&parser);
          if ((this->move_data).top_left.x == true) {
            pEVar10 = this->move_target;
            local_d8 = VVar4.x;
            Property::Property<float>((Property *)&parser,local_d8,PX,-1);
            Element::SetProperty(pEVar10,Left,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
          if ((this->move_data).top_left.y == true) {
            pEVar10 = this->move_target;
            fStack_d4 = VVar4.y;
            Property::Property<float>((Property *)&parser,fStack_d4,PX,-1);
            Element::SetProperty(pEVar10,Top,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
          if ((this->move_data).bottom_right.x == true) {
            pEVar10 = this->move_target;
            local_48 = VVar5.x;
            Property::Property<float>((Property *)&parser,local_48,PX,-1);
            Element::SetProperty(pEVar10,Right,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
          if ((this->move_data).bottom_right.y == true) {
            pEVar10 = this->move_target;
            fStack_44 = VVar5.y;
            Property::Property<float>((Property *)&parser,fStack_44,PX,-1);
            Element::SetProperty(pEVar10,Bottom,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
        }
        if (this->size_target != (Element *)0x0) {
          VVar2 = (this->size_data).original_size;
          parser.specification.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(VVar2.y + (float)local_168._4_4_,VVar2.x + (float)local_168._0_4_);
          VVar4 = Vector2<float>::Round((Vector2<float> *)&parser);
          VVar3 = Math::Max<Rml::Vector2<float>>(VVar4,(Vector2f)0x0);
          VVar2 = (this->size_data).original_position_bottom_right;
          parser.specification.properties.
          super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(VVar2.y - (float)local_168._4_4_,VVar2.x - (float)local_168._0_4_);
          VVar4 = Vector2<float>::Round((Vector2<float> *)&parser);
          local_168._8_4_ = extraout_XMM0_Dc_00;
          local_168._0_4_ = VVar4.x;
          local_168._4_4_ = VVar4.y;
          local_168._12_4_ = extraout_XMM0_Dd_00;
          if ((this->size_data).width_height.x == true) {
            pEVar10 = this->size_target;
            local_d8 = VVar3.x;
            Property::Property<float>((Property *)&parser,local_d8,PX,-1);
            Element::SetProperty(pEVar10,Width,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
          if ((this->size_data).width_height.y == true) {
            pEVar10 = this->size_target;
            fStack_d4 = VVar3.y;
            Property::Property<float>((Property *)&parser,fStack_d4,PX,-1);
            Element::SetProperty(pEVar10,Height,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
          if ((this->size_data).bottom_right.x == true) {
            pEVar10 = this->size_target;
            Property::Property<float>((Property *)&parser,(float)local_168._0_4_,PX,-1);
            Element::SetProperty(pEVar10,Right,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
          if ((this->size_data).bottom_right.y == true) {
            pEVar10 = this->size_target;
            Property::Property<float>((Property *)&parser,(float)local_168._4_4_,PX,-1);
            Element::SetProperty(pEVar10,Bottom,(Property *)&parser);
            Property::~Property((Property *)&parser);
          }
        }
        parser.specification.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        parser.specification.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        parser.specification.properties.
        super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVVar11 = itlib::
                  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                  ::operator[]<char_const(&)[9]>
                            ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                              *)&parser,(char (*) [9])"handle_x");
        Variant::operator=(pVVar11,(float *)&move_target_name);
        pVVar11 = itlib::
                  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                  ::operator[]<char_const(&)[9]>
                            ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                              *)&parser,(char (*) [9])"handle_y");
        Variant::operator=(pVVar11,(float *)((long)&move_target_name._M_dataplus._M_p + 4));
        Element::DispatchEvent(&this->super_Element,Handledrag,(Dictionary *)&parser);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)&parser);
      }
    }
  }
  return;
}

Assistant:

void ElementHandle::ProcessDefaultAction(Event& event)
{
	Element::ProcessDefaultAction(event);

	if (event.GetTargetElement() == this)
	{
		if (!initialised && GetOwnerDocument())
		{
			const String move_target_name = GetAttribute<String>("move_target", "");
			if (!move_target_name.empty())
				move_target = GetElementById(move_target_name);

			const String size_target_name = GetAttribute<String>("size_target", "");
			if (!size_target_name.empty())
				size_target = GetElementById(size_target_name);

			const String edge_margin_str = GetAttribute<String>("edge_margin", "0px");
			edge_margin = {};
			if (edge_margin_str != "none")
			{
				HandleEdgeMarginParser parser;
				if (!parser.Parse(edge_margin_str, edge_margin))
					Log::Message(Log::LT_WARNING, "Failed to parse 'edge_margin' attribute for element '%s'.", GetAddress().c_str());
			}

			initialised = true;
		}

		if (event == EventId::Dragstart)
		{
			using namespace Style;
			Context* context = GetContext();
			drag_start = event.GetUnprojectedMouseScreenPos();
			drag_delta_min = {-FLT_MAX, -FLT_MAX};
			drag_delta_max = {FLT_MAX, FLT_MAX};

			if (move_target && context)
			{
				ElementHandleTargetData move_target_data(move_target, context, edge_margin);
				move_data = move_target_data.GetMoveData(drag_delta_min, drag_delta_max);
			}

			if (size_target && context)
			{
				ElementHandleTargetData size_target_data(size_target, context, edge_margin);
				size_data = size_target_data.GetSizeData(drag_delta_min, drag_delta_max);
			}

			drag_delta_min = Math::Min(drag_delta_min, Vector2f{0, 0});
			drag_delta_max = Math::Max(drag_delta_max, Vector2f{0, 0});
		}
		else if (event == EventId::Drag)
		{
			const Vector2f delta = Math::Clamp(event.GetUnprojectedMouseScreenPos() - drag_start, drag_delta_min, drag_delta_max);

			if (move_target)
			{
				const Vector2f new_position_top_left = (move_data.original_position_top_left + delta).Round();
				const Vector2f new_position_bottom_right = (move_data.original_position_bottom_right - delta).Round();

				if (move_data.top_left.x)
					move_target->SetProperty(PropertyId::Left, Property(new_position_top_left.x, Unit::PX));
				if (move_data.top_left.y)
					move_target->SetProperty(PropertyId::Top, Property(new_position_top_left.y, Unit::PX));
				if (move_data.bottom_right.x)
					move_target->SetProperty(PropertyId::Right, Property(new_position_bottom_right.x, Unit::PX));
				if (move_data.bottom_right.y)
					move_target->SetProperty(PropertyId::Bottom, Property(new_position_bottom_right.y, Unit::PX));
			}

			if (size_target)
			{
				const Vector2f new_size = Math::Max((size_data.original_size + delta).Round(), Vector2f(0.f));
				const Vector2f new_position_bottom_right = (size_data.original_position_bottom_right - delta).Round();

				if (size_data.width_height.x)
					size_target->SetProperty(PropertyId::Width, Property(new_size.x, Unit::PX));
				if (size_data.width_height.y)
					size_target->SetProperty(PropertyId::Height, Property(new_size.y, Unit::PX));
				if (size_data.bottom_right.x)
					size_target->SetProperty(PropertyId::Right, Property(new_position_bottom_right.x, Unit::PX));
				if (size_data.bottom_right.y)
					size_target->SetProperty(PropertyId::Bottom, Property(new_position_bottom_right.y, Unit::PX));
			}

			Dictionary parameters;
			parameters["handle_x"] = delta.x;
			parameters["handle_y"] = delta.y;
			DispatchEvent(EventId::Handledrag, parameters);
		}
	}
}